

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::assignCompressedObjectNumbers(QPDFWriter *this,QPDFObjGen og)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  size_type sVar4;
  mapped_type *this_00;
  reference pQVar5;
  Object *pOVar6;
  QPDFObjGen *iter;
  iterator __end1;
  iterator __begin1;
  mapped_type *__range1;
  QPDFWriter *pQStack_18;
  int objid;
  QPDFWriter *this_local;
  QPDFObjGen og_local;
  
  pQStack_18 = this;
  this_local = (QPDFWriter *)og;
  __range1._4_4_ = QPDFObjGen::getObj((QPDFObjGen *)&this_local);
  iVar2 = QPDFObjGen::getGen((QPDFObjGen *)&this_local);
  if (iVar2 == 0) {
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    sVar4 = std::
            map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
            ::count(&peVar3->object_stream_to_objects,(key_type *)((long)&__range1 + 4));
    if (sVar4 != 0) {
      peVar3 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      this_00 = std::
                map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
                ::operator[](&peVar3->object_stream_to_objects,(key_type *)((long)&__range1 + 4));
      __end1 = std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::begin(this_00);
      iter = (QPDFObjGen *)std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>
                                         *)&iter), bVar1) {
        pQVar5 = __gnu_cxx::
                 __normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>
                 ::operator*(&__end1);
        peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        iVar2 = peVar3->next_objid;
        peVar3->next_objid = iVar2 + 1;
        peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pOVar6 = ObjTable<QPDFWriter::Object>::operator[]
                           (&(peVar3->obj).super_ObjTable<QPDFWriter::Object>,*pQVar5);
        pOVar6->renumber = iVar2;
        __gnu_cxx::
        __normal_iterator<QPDFObjGen_*,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>::
        operator++(&__end1);
      }
    }
  }
  return;
}

Assistant:

void
QPDFWriter::assignCompressedObjectNumbers(QPDFObjGen og)
{
    int objid = og.getObj();
    if ((og.getGen() != 0) || (m->object_stream_to_objects.count(objid) == 0)) {
        // This is not an object stream.
        return;
    }

    // Reserve numbers for the objects that belong to this object stream.
    for (auto const& iter: m->object_stream_to_objects[objid]) {
        m->obj[iter].renumber = m->next_objid++;
    }
}